

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O3

tuple<Move,_unsigned_long,_unsigned_long> * __thiscall
Controller::undoMove
          (tuple<Move,_unsigned_long,_unsigned_long> *__return_storage_ptr__,Controller *this)

{
  Move MVar1;
  unsigned_long col;
  unsigned_long row;
  optional<unsigned_long> oVar2;
  
  oVar2 = UndoMove::GetMove((this->undoMoveService)._M_t.
                            super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                            super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                            super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl);
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    MVar1 = NOT_ALLOWED;
    col = 0;
    row = 0;
  }
  else {
    col = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload % 10;
    row = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload / 10 & 0xffffffff;
    MVar1 = Board::checkMove((this->board)._M_t.
                             super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
                             super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                             super__Head_base<0UL,_Board_*,_false>._M_head_impl,row,col);
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
  super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = col;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = row;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>).
  super__Head_base<0UL,_Move,_false>._M_head_impl = MVar1;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Move, size_t, size_t> Controller::undoMove()
{
    std::optional<size_t> position = undoMoveService->GetMove();
    if ( position == std::nullopt )
    {
        return { Move::NOT_ALLOWED, 0, 0 };
    }

    uint row = position.value() / 10;
    uint col = position.value() % 10;
    Move move = board->checkMove( row, col );
    return { move, row, col };
}